

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

gdImagePtr gdImageCreateTrueColor(int sx,int sy)

{
  int iVar1;
  gdImagePtr __s;
  int **ppiVar2;
  int *piVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar1 = overflow2(sx,sy);
  if ((((iVar1 == 0) && (iVar1 = overflow2(8,sy), iVar1 == 0)) &&
      (iVar1 = overflow2(4,sx), iVar1 == 0)) &&
     (__s = (gdImagePtr)gdMalloc(0x1ca8), __s != (gdImagePtr)0x0)) {
    memset(__s,0,0x1ca8);
    ppiVar2 = (int **)gdMalloc((long)sy << 3);
    __s->tpixels = ppiVar2;
    if (ppiVar2 != (int **)0x0) {
      __s->polyInts = (int *)0x0;
      __s->polyAllocated = 0;
      __s->style = (int *)0x0;
      __s->brush = (gdImageStruct *)0x0;
      __s->tile = (gdImageStruct *)0x0;
      if (sy < 1) {
LAB_0010afc7:
        __s->sx = sx;
        __s->sy = sy;
        __s->transparent = -1;
        __s->interlace = 0;
        __s->thick = 1;
        __s->trueColor = 1;
        __s->alphaBlendingFlag = 1;
        __s->saveAlphaFlag = 0;
        __s->AA = 0;
        __s->cx1 = 0;
        __s->cy1 = 0;
        __s->cx2 = sx + -1;
        __s->cy2 = sy + -1;
        __s->res_x = 0x60;
        __s->res_y = 0x60;
        __s->interpolation = (interpolation_method)0x0;
        __s->interpolation_id = GD_BILINEAR_FIXED;
        return __s;
      }
      uVar4 = 1;
LAB_0010af8b:
      piVar3 = (int *)gdCalloc((long)sx,4);
      __s->tpixels[uVar4 - 1] = piVar3;
      if (__s->tpixels[uVar4 - 1] != (int *)0x0) goto code_r0x0010afb7;
      if (uVar4 != 1) {
        do {
          gdFree(__s->tpixels[(int)uVar4 - 2]);
          uVar4 = uVar4 - 1;
        } while (1 < (long)uVar4);
      }
      gdFree(__s->tpixels);
    }
    gdFree(__s);
  }
  return (gdImagePtr)0x0;
code_r0x0010afb7:
  bVar5 = uVar4 == (uint)sy;
  uVar4 = uVar4 + 1;
  if (bVar5) goto LAB_0010afc7;
  goto LAB_0010af8b;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateTrueColor (int sx, int sy)
{
	int i;
	gdImagePtr im;

	if (overflow2(sx, sy)) {
		return NULL;
	}
	if (overflow2(sizeof (int *), sy)) {
		return 0;
	}
	if (overflow2(sizeof(int), sx)) {
		return NULL;
	}

	im = (gdImage *) gdMalloc (sizeof (gdImage));
	if (!im) {
		return 0;
	}
	memset (im, 0, sizeof (gdImage));

	im->tpixels = (int **) gdMalloc (sizeof (int *) * sy);
	if (!im->tpixels) {
		gdFree(im);
		return 0;
	}
	im->polyInts = 0;
	im->polyAllocated = 0;
	im->brush = 0;
	im->tile = 0;
	im->style = 0;
	for (i = 0; (i < sy); i++) {
		im->tpixels[i] = (int *) gdCalloc (sx, sizeof (int));
		if (!im->tpixels[i]) {
			/* 2.0.34 */
			i--;
			while (i >= 0) {
				gdFree(im->tpixels[i]);
				i--;
			}
			gdFree(im->tpixels);
			gdFree(im);
			return 0;
		}
	}
	im->sx = sx;
	im->sy = sy;
	im->transparent = (-1);
	im->interlace = 0;
	im->trueColor = 1;
	/* 2.0.2: alpha blending is now on by default, and saving of alpha is
	   off by default. This allows font antialiasing to work as expected
	   on the first try in JPEGs -- quite important -- and also allows
	   for smaller PNGs when saving of alpha channel is not really
	   desired, which it usually isn't! */
	im->saveAlphaFlag = 0;
	im->alphaBlendingFlag = 1;
	im->thick = 1;
	im->AA = 0;
	im->cx1 = 0;
	im->cy1 = 0;
	im->cx2 = im->sx - 1;
	im->cy2 = im->sy - 1;
	im->res_x = GD_RESOLUTION;
	im->res_y = GD_RESOLUTION;
	im->interpolation = NULL;
	im->interpolation_id = GD_BILINEAR_FIXED;
	return im;
}